

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O0

_Bool av1_resize_vert_dir_c
                (uint8_t *intbuf,uint8_t *output,int out_stride,int height,int height2,int width2,
                int start_col)

{
  uint8_t *arr;
  uint8_t *arr_00;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int i;
  uint8_t *arrbuf2;
  uint8_t *arrbuf;
  _Bool mem_status;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int iVar1;
  undefined1 local_21;
  
  local_21 = true;
  arr = (uint8_t *)aom_malloc(0x6ef2e7);
  arr_00 = (uint8_t *)aom_malloc(0x6ef2fa);
  if ((arr == (uint8_t *)0x0) || (iVar1 = in_stack_00000008, arr_00 == (uint8_t *)0x0)) {
    local_21 = false;
    iVar1 = in_stack_ffffffffffffffc4;
  }
  else {
    for (; iVar1 < in_R9D; iVar1 = iVar1 + 1) {
      fill_col_to_arr((uint8_t *)(in_RDI + iVar1),in_R9D,in_ECX,arr);
      down2_symeven(intbuf,output._4_4_,(uint8_t *)CONCAT44(out_stride,height),height2);
      fill_arr_to_col((uint8_t *)(in_RSI + iVar1),in_EDX,in_R8D,arr_00);
    }
  }
  aom_free((void *)CONCAT44(iVar1,in_stack_ffffffffffffffc0));
  aom_free((void *)CONCAT44(iVar1,in_stack_ffffffffffffffc0));
  return local_21;
}

Assistant:

bool av1_resize_vert_dir_c(uint8_t *intbuf, uint8_t *output, int out_stride,
                           int height, int height2, int width2, int start_col) {
  bool mem_status = true;
  uint8_t *arrbuf = (uint8_t *)aom_malloc(sizeof(*arrbuf) * height);
  uint8_t *arrbuf2 = (uint8_t *)aom_malloc(sizeof(*arrbuf2) * height2);
  if (arrbuf == NULL || arrbuf2 == NULL) {
    mem_status = false;
    goto Error;
  }

  for (int i = start_col; i < width2; ++i) {
    fill_col_to_arr(intbuf + i, width2, height, arrbuf);
    down2_symeven(arrbuf, height, arrbuf2, 0);
    fill_arr_to_col(output + i, out_stride, height2, arrbuf2);
  }

Error:
  aom_free(arrbuf);
  aom_free(arrbuf2);
  return mem_status;
}